

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

MAP_HANDLE Map_Create(MAP_FILTER_CALLBACK mapFilterFunc)

{
  MAP_HANDLE pMVar1;
  MAP_HANDLE_DATA *result;
  MAP_FILTER_CALLBACK mapFilterFunc_local;
  
  pMVar1 = (MAP_HANDLE)calloc(1,0x20);
  if (pMVar1 != (MAP_HANDLE)0x0) {
    pMVar1->keys = (char **)0x0;
    pMVar1->values = (char **)0x0;
    pMVar1->count = 0;
    pMVar1->mapFilterCallback = mapFilterFunc;
  }
  return pMVar1;
}

Assistant:

MAP_HANDLE Map_Create(MAP_FILTER_CALLBACK mapFilterFunc)
{
    /*Codes_SRS_MAP_02_001: [Map_Create shall create a new, empty map.]*/
    MAP_HANDLE_DATA* result = (MAP_HANDLE_DATA*)calloc(1, sizeof(MAP_HANDLE_DATA));
    /*Codes_SRS_MAP_02_002: [If during creation there are any error, then Map_Create shall return NULL.]*/
    if (result != NULL)
    {
        /*Codes_SRS_MAP_02_003: [Otherwise, it shall return a non-NULL handle that can be used in subsequent calls.] */
        result->keys = NULL;
        result->values = NULL;
        result->count = 0;
        result->mapFilterCallback = mapFilterFunc;
    }
    return (MAP_HANDLE)result;
}